

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cc
# Opt level: O3

void __thiscall tt::FileUtil::AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = fwrite_unlocked(logline,1,len,(FILE *)this->m_fp);
  while( true ) {
    if (sVar2 == len) {
      return;
    }
    sVar3 = fwrite_unlocked(logline + sVar2,1,len - sVar2,(FILE *)this->m_fp);
    if (sVar3 == 0) break;
    sVar2 = sVar2 + sVar3;
  }
  iVar1 = ferror((FILE *)this->m_fp);
  if (iVar1 == 0) {
    return;
  }
  append();
  return;
}

Assistant:

void FileUtil::AppendFile::append(const char* logline,const size_t len){
	size_t n = mywrite(logline,len);
	size_t remain = len - n;

	while( remain > 0){
		size_t x = mywrite(logline + n, remain);

		if(x == 0){
			int err = ferror(m_fp);
			if(err) fprintf(stderr,"AppendFile::append() failed !\n");
			break;
		}
		n += x;
		remain = len - n;
	}
}